

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O0

void __thiscall
xercesc_4_0::CMStateSetEnumerator::CMStateSetEnumerator
          (CMStateSetEnumerator *this,CMStateSet *toEnum,XMLSize_t start)

{
  bool bVar1;
  uint uVar2;
  ulong uStack_28;
  XMLInt32 mask;
  XMLSize_t i;
  XMLSize_t start_local;
  CMStateSet *toEnum_local;
  CMStateSetEnumerator *this_local;
  
  XMemory::XMemory((XMemory *)this);
  this->fToEnum = toEnum;
  this->fIndexCount = 0xffffffffffffffff;
  this->fLastValue = 0;
  if (0x20 < start) {
    this->fIndexCount = ((start >> 5) - 1) * 0x20;
  }
  findNext(this);
  bVar1 = hasMoreElements(this);
  if ((bVar1) && (this->fIndexCount < start)) {
    for (uStack_28 = 0; uStack_28 < start - this->fIndexCount; uStack_28 = uStack_28 + 1) {
      uVar2 = (uint)(1L << ((byte)uStack_28 & 0x3f));
      if ((this->fLastValue & uVar2) != 0) {
        this->fLastValue = (uVar2 ^ 0xffffffff) & this->fLastValue;
      }
    }
    if (this->fLastValue == 0) {
      findNext(this);
    }
  }
  return;
}

Assistant:

CMStateSetEnumerator(const CMStateSet* toEnum, XMLSize_t start = 0) :
      fToEnum(toEnum),
      fIndexCount((XMLSize_t)-1),
      fLastValue(0)
    {
        // if a starting bit is specified, place fIndexCount at the beginning of the previous 32 bit area
        // so the findNext moves to the one where 'start' is located
        if(start > 32)
            fIndexCount = (start/32 - 1) * 32;
        findNext();
        // if we found data, and fIndexCount is still pointing to the area where 'start' is located, erase the bits before 'start'
        if(hasMoreElements() && fIndexCount < start)
        {
            for(XMLSize_t i=0;i< (start - fIndexCount);i++)
            {
                XMLInt32 mask=1UL << i;
                if(fLastValue & mask)
                    fLastValue &= ~mask;
            }
            // in case the 32 bit area contained only bits before 'start', advance
            if(fLastValue==0)
                findNext();
        }
    }